

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_shuffle_8(c_v256 a,c_v256 pattern)

{
  c_v256 *in_RDI;
  int c;
  
  for (c = 0; c < 0x20; c = c + 1) {
    in_RDI->u8[c] = a.u8[(int)(pattern.u8[c] & 0x1f)];
  }
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shuffle_8(c_v256 a, c_v256 pattern) {
  c_v256 t;
  int c;
  for (c = 0; c < 32; c++)
    t.u8[c] = a.u8[CONFIG_BIG_ENDIAN ? 31 - (pattern.u8[c] & 31)
                                     : pattern.u8[c] & 31];

  return t;
}